

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree_node.h
# Opt level: O0

RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_> *
__thiscall
data_structures::
RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>::
insertLeft(RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
           *this,RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 *node,bool is_red)

{
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar1;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *temp_node;
  bool is_red_local;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node_local;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *this_local;
  
  pRVar1 = this->_left;
  if (node != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
               *)0x0) {
    node->_parent = this;
    node->_is_left = true;
    node->_is_red = is_red;
  }
  this->_left = node;
  return pRVar1;
}

Assistant:

inline
    RBTreeNode<T> * RBTreeNode<T>::insertLeft(RBTreeNode<T> *node, const bool is_red){
        RBTreeNode<T>* temp_node = _left;
        if (node != nullptr) {
            node->_parent = this;
            node->_is_left = true;
            node->_is_red = is_red;
        }
        _left = node;
        return temp_node;
    }